

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteTest.h
# Opt level: O2

void UnitTest::
     ExecuteTest<UnitTest::(anonymous_namespace)::DeferredTestReporterFixtureReportTestStartCreatesANewDeferredTestHelper>
               (DeferredTestReporterFixtureReportTestStartCreatesANewDeferredTestHelper *testObject,
               TestDetails *details)

{
  TestResults *results;
  int iVar1;
  TestDetails **ppTVar2;
  TestResults **ppTVar3;
  DeferredTestResultList *pDVar4;
  undefined8 *puVar5;
  int local_4b8 [2];
  TestDetails local_4b0;
  SignalTranslator sig;
  
  ppTVar2 = CurrentTest::Details();
  *ppTVar2 = details;
  SignalTranslator::SignalTranslator(&sig);
  iVar1 = __sigsetjmp(SignalTranslator::s_jumpTarget,1);
  if (iVar1 == 0) {
    DeferredTestReporter::ReportTestStart
              ((DeferredTestReporter *)testObject,
               &(testObject->super_DeferredTestReporterFixture).details);
    ppTVar3 = CurrentTest::Results();
    results = *ppTVar3;
    local_4b8[1] = 1;
    pDVar4 = DeferredTestReporter::GetResults((DeferredTestReporter *)testObject);
    local_4b8[0] = (int)((ulong)((long)(pDVar4->
                                       super__Vector_base<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pDVar4->
                                      super__Vector_base<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 7);
    ppTVar2 = CurrentTest::Details();
    TestDetails::TestDetails(&local_4b0,*ppTVar2,0x31);
    CheckEqual<int,int>(results,local_4b8 + 1,local_4b8,&local_4b0);
    SignalTranslator::~SignalTranslator(&sig);
    return;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = "Unhandled system exception";
  __cxa_throw(puVar5,&char_const*::typeinfo,0);
}

Assistant:

void ExecuteTest(T& testObject, TestDetails const& details)
{
	CurrentTest::Details() = &details;

	try
	{
#ifdef UNITTEST_POSIX
		UNITTEST_THROW_SIGNALS
#endif
		testObject.RunImpl();
	}
	catch (AssertException const& e)
	{
		CurrentTest::Results()->OnTestFailure(
			TestDetails(details.testName, details.suiteName, e.Filename(), e.LineNumber()), e.what());
	}
	catch (std::exception const& e)
	{
		MemoryOutStream stream;
		stream << "Unhandled exception: " << e.what();
		CurrentTest::Results()->OnTestFailure(details, stream.GetText());
	}
	catch (...)
	{
		CurrentTest::Results()->OnTestFailure(details, "Unhandled exception: Crash!");
	}
}